

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix
          (IntrinsicGeometryInterface *this)

{
  size_t rows;
  size_t i_1;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  size_t i;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  _Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> local_b8;
  unsigned_long local_a0;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_98;
  SparseMatrix<double,_0,_int> local_80;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_38;
  
  DependentQuantity::ensureHave
            (&(this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity);
  DependentQuantity::ensureHave(&(this->faceAreasQ).super_DependentQuantity);
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._0_8_ = (this->super_BaseGeometryInterface).mesh;
  local_80.m_innerSize = ((SurfaceMesh *)local_80._0_8_)->nFacesFillCount;
  local_80.m_outerSize = 0;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            (&local_98,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_80);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            (&local_38,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_80);
  while (local_98.iCurr != local_38.iCurr) {
    local_a0 = (this->super_BaseGeometryInterface).faceIndices.data.
               super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[local_98.iCurr];
    ::std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<unsigned_long&,unsigned_long&,double&>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_b8,&local_a0,&local_a0,
               (this->faceAreas).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_data + local_98.iCurr);
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&local_98);
  }
  rows = ((this->super_BaseGeometryInterface).mesh)->nFacesCount;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&local_80,rows,rows);
  Eigen::SparseMatrix<double,_0,_int>::operator=(&this->faceGalerkinMassMatrix,&local_80);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&local_80);
  local_80._0_8_ = local_b8._M_impl.super__Vector_impl_data._M_start;
  local_98.mesh = (ParentMeshT *)local_b8._M_impl.super__Vector_impl_data._M_finish;
  Eigen::SparseMatrix<double,0,int>::
  setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
            ((SparseMatrix<double,0,int> *)&this->faceGalerkinMassMatrix,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)&local_80,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)&local_98);
  ::std::_Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
  ~_Vector_base(&local_b8);
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix() {
  faceIndicesQ.ensureHave();
  faceAreasQ.ensureHave();

  std::vector<Eigen::Triplet<double>> triplets;
  for (Face f : mesh.faces()) {
    size_t i = faceIndices[f];
    triplets.emplace_back(i, i, faceAreas[f]);
  }

  faceGalerkinMassMatrix = Eigen::SparseMatrix<double>(mesh.nFaces(), mesh.nFaces());
  faceGalerkinMassMatrix.setFromTriplets(triplets.begin(), triplets.end());
}